

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare_statement.cpp
# Opt level: O3

void __thiscall
duckdb::PrepareStatement::PrepareStatement(PrepareStatement *this,PrepareStatement *other)

{
  pointer pcVar1;
  pointer pSVar2;
  pointer *__ptr;
  
  SQLStatement::SQLStatement(&this->super_SQLStatement,&other->super_SQLStatement);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__PrepareStatement_0243bb30;
  pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(&other->statement);
  (*pSVar2->_vptr_SQLStatement[3])(&this->statement,pSVar2);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (other->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (other->name)._M_string_length);
  return;
}

Assistant:

PrepareStatement::PrepareStatement(const PrepareStatement &other)
    : SQLStatement(other), statement(other.statement->Copy()), name(other.name) {
}